

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offBasePtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  U32 UVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  int iVar18;
  byte *pbVar19;
  BYTE *pBVar20;
  uint *puVar21;
  uint uVar22;
  uint uVar23;
  ulong *puVar24;
  U32 *pUVar25;
  ulong uVar26;
  uint *puVar27;
  uint *puVar28;
  BYTE *pBVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong *puVar33;
  uint uVar34;
  uint uVar35;
  ulong *puVar36;
  U32 UVar37;
  uint uVar38;
  uint uVar39;
  byte *pbVar40;
  ulong *puVar41;
  uint uVar42;
  U32 *pUVar43;
  uint uVar44;
  ulong *puVar45;
  bool bVar46;
  BYTE *pInLoopLimit;
  U32 dummy32;
  uint local_124;
  U32 *local_110;
  byte *local_108;
  U32 *local_e8;
  byte *local_e0;
  ulong local_d8;
  ulong local_b8;
  uint local_70;
  U32 local_6c;
  U32 *local_68;
  ulong local_60;
  U32 *local_58;
  BYTE *local_50;
  ulong *local_48;
  ulong *local_40;
  ulong *local_38;
  
  uVar8 = (ms->cParams).hashLog;
  if (0x20 < uVar8) goto LAB_00205433;
  local_60 = (ulong)(mls - 5);
  cVar17 = (char)uVar8;
  switch(local_60) {
  case 0:
    lVar10 = -0x30e4432345000000;
    break;
  case 1:
    lVar10 = -0x30e4432340650000;
    break;
  case 2:
    lVar10 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar9 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_002047f5;
  default:
    uVar9 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar17 & 0x1fU));
    goto LAB_002047fa;
  }
  uVar9 = lVar10 * *(long *)ip;
LAB_002047f5:
  uVar9 = uVar9 >> (-cVar17 & 0x3fU);
LAB_002047fa:
  pBVar3 = (ms->window).base;
  uVar32 = (int)ip - (int)pBVar3;
  uVar8 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar2 = (ms->window).lowLimit;
  UVar37 = uVar32 - uVar8;
  if (uVar32 - UVar2 <= uVar8) {
    UVar37 = UVar2;
  }
  if (ms->loadedDictEnd != 0) {
    UVar37 = UVar2;
  }
  uVar38 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar8 = uVar32 - uVar38;
  if (uVar32 < uVar38) {
    uVar8 = 0;
  }
  uVar44 = UVar37;
  if (UVar37 < uVar8) {
    uVar44 = uVar8;
  }
  local_124 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x107,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (dictMode == ZSTD_dedicatedDictSearch) {
    __assert_fail("dictMode != ZSTD_dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x108,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_58 = ms->hashTable;
  pUVar43 = ms->chainTable;
  uVar39 = local_58[uVar9];
  uVar26 = 0;
  uVar30 = local_124;
  if (uVar44 < uVar39) {
    uVar13 = 0;
    do {
      uVar26 = (ulong)uVar39;
      uVar14 = (ulong)((uVar39 & uVar38) * 2);
      if ((pUVar43[uVar14 + 1] != 1) || (uVar30 < 2)) {
        uVar26 = uVar13;
        if (pUVar43[uVar14 + 1] == 1) {
          (pUVar43 + uVar14)[0] = 0;
          (pUVar43 + uVar14)[1] = 0;
        }
        break;
      }
      pUVar43[uVar14 + 1] = (U32)uVar13;
      uVar30 = uVar30 - 1;
      uVar39 = pUVar43[uVar14];
      uVar13 = uVar26;
    } while (uVar44 < uVar39);
  }
  local_68 = pUVar43;
  if ((int)uVar26 != 0) {
    pBVar4 = (ms->window).dictBase;
    do {
      uVar39 = (ms->window).dictLimit;
      pbVar19 = (byte *)(ulong)uVar39;
      local_48 = (ulong *)(pBVar4 + (long)pbVar19);
      uVar35 = (uint)uVar26;
      puVar45 = (ulong *)iend;
      pBVar20 = pBVar3;
      if (uVar35 < uVar39) {
        puVar45 = local_48;
        pBVar20 = pBVar4;
      }
      uVar42 = (ms->window).lowLimit;
      uVar22 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar23 = uVar35 - uVar22;
      if (uVar35 - uVar42 <= uVar22) {
        uVar23 = uVar42;
      }
      if (uVar35 < uVar44) {
        __assert_fail("curr >= btLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x60,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      puVar41 = (ulong *)(pBVar20 + uVar26);
      if (puVar45 <= puVar41) {
        __assert_fail("ip < iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x61,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      uVar42 = pUVar43[(ulong)((uVar35 & uVar38) * 2) + 1];
      uVar34 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar22 = (uVar35 & uVar34) * 2;
      local_e8 = pUVar43 + uVar22;
      local_110 = local_e8 + 1;
      if ((uVar30 != 0) && (uVar22 = pUVar43[uVar22], uVar23 < uVar22)) {
        local_50 = pBVar3 + (long)pbVar19;
        local_38 = (ulong *)((long)puVar45 + -3);
        local_40 = (ulong *)((long)puVar45 + -1);
        local_e0 = (byte *)0x0;
        local_108 = (byte *)0x0;
        uVar31 = uVar30;
        do {
          pbVar12 = local_108;
          if (local_e0 < local_108) {
            pbVar12 = local_e0;
          }
          if (uVar35 <= uVar22) {
            __assert_fail("matchIndex < curr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                          ,0x66,
                          "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                         );
          }
          pBVar20 = pBVar3;
          if (dictMode == ZSTD_extDict) {
            if ((uVar35 < uVar39) || (pbVar19 <= pbVar12 + uVar22)) {
              if (pbVar12 + uVar22 < pbVar19) {
                pBVar20 = pBVar4;
              }
              goto LAB_00204b17;
            }
            sVar11 = ZSTD_count_2segments
                               ((byte *)((long)puVar41 + (long)pbVar12),
                                pBVar4 + uVar22 + (long)pbVar12,(BYTE *)puVar45,(BYTE *)local_48,
                                local_50);
            pbVar12 = pbVar12 + sVar11;
            pBVar20 = pBVar3 + uVar22;
            pUVar43 = local_68;
            if (pbVar12 + uVar22 < pbVar19) {
              pBVar20 = pBVar4 + uVar22;
            }
          }
          else {
LAB_00204b17:
            if ((uVar39 <= uVar35) && (pbVar12 + uVar22 < pbVar19)) {
              __assert_fail("(matchIndex+matchLength >= dictLimit) || (curr < dictLimit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x72,
                            "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                           );
            }
            puVar24 = (ulong *)((long)puVar41 + (long)pbVar12);
            puVar33 = (ulong *)(pBVar20 + uVar22 + (long)pbVar12);
            puVar36 = puVar24;
            if (puVar24 < (ulong *)((long)puVar45 - 7U)) {
              uVar13 = *puVar24 ^ *puVar33;
              uVar26 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              pbVar40 = (byte *)(uVar26 >> 3 & 0x1fffffff);
              if (*puVar33 == *puVar24) {
                do {
                  puVar36 = puVar36 + 1;
                  puVar33 = puVar33 + 1;
                  if ((ulong *)((long)puVar45 - 7U) <= puVar36) goto LAB_00204b9e;
                  uVar13 = *puVar36 ^ *puVar33;
                  uVar26 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  pbVar40 = (byte *)((long)puVar36 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar24));
                } while (*puVar33 == *puVar36);
              }
            }
            else {
LAB_00204b9e:
              if ((puVar36 < local_38) && ((int)*puVar33 == (int)*puVar36)) {
                puVar36 = (ulong *)((long)puVar36 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar36 < local_40) && ((short)*puVar33 == (short)*puVar36)) {
                puVar36 = (ulong *)((long)puVar36 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar36 < puVar45) {
                puVar36 = (ulong *)((long)puVar36 + (ulong)((byte)*puVar33 == (byte)*puVar36));
              }
              pbVar40 = (byte *)((long)puVar36 - (long)puVar24);
            }
            pbVar12 = pbVar40 + (long)pbVar12;
            pBVar20 = pBVar20 + uVar22;
          }
          if ((ulong *)((long)puVar41 + (long)pbVar12) == puVar45) {
            bVar46 = false;
          }
          else {
            pUVar25 = pUVar43 + (uVar22 & uVar34) * 2;
            if (pBVar20[(long)pbVar12] < (byte)*(ulong *)((long)puVar41 + (long)pbVar12)) {
              *local_e8 = uVar22;
              local_e0 = pbVar12;
              if (uVar44 < uVar22) {
                pUVar25 = pUVar25 + 1;
                local_e8 = pUVar25;
LAB_00204c67:
                uVar22 = *pUVar25;
                bVar46 = true;
              }
              else {
                bVar46 = false;
                local_e8 = &local_6c;
              }
            }
            else {
              *local_110 = uVar22;
              local_110 = pUVar25;
              local_108 = pbVar12;
              if (uVar44 < uVar22) goto LAB_00204c67;
              bVar46 = false;
              local_110 = &local_6c;
            }
          }
        } while (((bVar46) && (uVar31 = uVar31 - 1, uVar31 != 0)) && (uVar23 < uVar22));
      }
      *local_110 = 0;
      *local_e8 = 0;
      uVar30 = uVar30 + 1;
      uVar26 = (ulong)uVar42;
    } while (uVar42 != 0);
  }
  pBVar4 = (ms->window).dictBase;
  uVar13 = (ulong)(ms->window).dictLimit;
  uVar26 = (ulong)((uVar38 & uVar32) * 2);
  puVar28 = pUVar43 + uVar26;
  puVar27 = pUVar43 + uVar26 + 1;
  uVar39 = uVar32 + 9;
  uVar44 = local_58[uVar9];
  uVar26 = (ulong)uVar44;
  local_58[uVar9] = uVar32;
  if (UVar37 < uVar44) {
    uVar9 = 0;
    local_b8 = 0;
    local_108 = (byte *)0x0;
    do {
      pbVar19 = (byte *)local_b8;
      if (local_108 < local_b8) {
        pbVar19 = local_108;
      }
      uVar44 = (uint)uVar26;
      if ((dictMode == ZSTD_extDict) && ((long)pbVar19 + uVar26 < uVar13)) {
        pBVar1 = pBVar4 + uVar26;
        sVar11 = ZSTD_count_2segments
                           (ip + (long)pbVar19,pBVar1 + (long)pbVar19,iend,pBVar4 + uVar13,
                            pBVar3 + uVar13);
        uVar14 = sVar11 + (long)pbVar19;
        pBVar20 = pBVar3 + uVar26;
        if (uVar14 + uVar26 < uVar13) {
          pBVar20 = pBVar1;
        }
      }
      else {
        puVar45 = (ulong *)(ip + (long)pbVar19);
        puVar41 = (ulong *)(pBVar3 + uVar26 + (long)pbVar19);
        puVar33 = puVar45;
        if (puVar45 < iend + -7) {
          uVar15 = *puVar45 ^ *puVar41;
          uVar14 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
            }
          }
          uVar14 = uVar14 >> 3 & 0x1fffffff;
          if (*puVar41 == *puVar45) {
            do {
              puVar33 = puVar33 + 1;
              puVar41 = puVar41 + 1;
              if (iend + -7 <= puVar33) goto LAB_00204e8e;
              uVar15 = *puVar33 ^ *puVar41;
              uVar14 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (long)puVar33 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar45);
            } while (*puVar41 == *puVar33);
          }
        }
        else {
LAB_00204e8e:
          if ((puVar33 < iend + -3) && ((int)*puVar41 == (int)*puVar33)) {
            puVar33 = (ulong *)((long)puVar33 + 4);
            puVar41 = (ulong *)((long)puVar41 + 4);
          }
          if ((puVar33 < iend + -1) && ((short)*puVar41 == (short)*puVar33)) {
            puVar33 = (ulong *)((long)puVar33 + 2);
            puVar41 = (ulong *)((long)puVar41 + 2);
          }
          if (puVar33 < iend) {
            puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar41 == (char)*puVar33));
          }
          uVar14 = (long)puVar33 - (long)puVar45;
        }
        uVar14 = uVar14 + (long)pbVar19;
        pBVar20 = pBVar3 + uVar26;
      }
      if (uVar9 < uVar14) {
        if (uVar39 - uVar44 < uVar14) {
          uVar39 = uVar44 + (int)uVar14;
        }
        uVar30 = (uVar32 - uVar44) + 1;
        if ((uVar30 == 0) || (uVar35 = (uint)*offBasePtr, uVar35 == 0)) goto LAB_002053f5;
        iVar18 = 0x1f;
        if (uVar30 != 0) {
          for (; uVar30 >> iVar18 == 0; iVar18 = iVar18 + -1) {
          }
        }
        iVar6 = 0x1f;
        if (uVar35 != 0) {
          for (; uVar35 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        if (iVar18 - iVar6 < ((int)uVar14 - (int)uVar9) * 4) {
          if (uVar32 == uVar44) {
            __assert_fail("(curr - matchIndex)>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                          ,0x14e,
                          "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                         );
          }
          *offBasePtr = (ulong)((uVar32 - uVar44) + 3);
          uVar9 = uVar14;
        }
        if (ip + uVar14 != iend) goto LAB_00204f59;
        uVar44 = 0;
        if (dictMode == ZSTD_dictMatchState) {
          local_124 = uVar44;
        }
      }
      else {
LAB_00204f59:
        puVar21 = local_68 + (uVar44 & uVar38) * 2;
        if (pBVar20[uVar14] < ip[uVar14]) {
          *puVar28 = uVar44;
          local_108 = (byte *)uVar14;
          if (uVar8 < uVar44) {
            puVar21 = puVar21 + 1;
            puVar28 = puVar21;
LAB_00204fb3:
            uVar26 = (ulong)*puVar21;
            uVar44 = 1;
          }
          else {
            uVar44 = 0;
            puVar28 = &local_70;
          }
        }
        else {
          *puVar27 = uVar44;
          puVar27 = puVar21;
          local_b8 = uVar14;
          if (uVar8 < uVar44) goto LAB_00204fb3;
          uVar44 = 0;
          puVar27 = &local_70;
        }
      }
    } while ((((char)uVar44 != '\0') && (local_124 = local_124 - 1, local_124 != 0)) &&
            (UVar37 < (uint)uVar26));
  }
  else {
    uVar9 = 0;
  }
  *puVar27 = 0;
  *puVar28 = 0;
  if (0x40000000 < local_124) {
    __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x16b,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((dictMode == ZSTD_dictMatchState) && (local_124 != 0)) {
    pZVar5 = ms->dictMatchState;
    uVar8 = (pZVar5->cParams).hashLog;
    if (0x20 < uVar8) {
LAB_00205433:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    if ((uint)local_60 < 4) {
      sVar11 = (*(code *)(&DAT_0026b3c0 + *(int *)(&DAT_0026b3c0 + local_60 * 4)))
                         (&DAT_0026b3c0 + *(int *)(&DAT_0026b3c0 + local_60 * 4));
      return sVar11;
    }
    uVar13 = (ulong)pZVar5->hashTable[(uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar8 & 0x1fU)];
    pBVar4 = (pZVar5->window).nextSrc;
    pBVar20 = (pZVar5->window).base;
    uVar26 = (long)pBVar4 - (long)pBVar20;
    uVar38 = (pZVar5->window).lowLimit;
    uVar30 = ~(-1 << ((char)(pZVar5->cParams).chainLog - 1U & 0x1f));
    iVar18 = (int)uVar26;
    uVar44 = iVar18 - uVar30;
    if (iVar18 - uVar38 <= uVar30) {
      uVar44 = uVar38;
    }
    if (uVar38 < pZVar5->hashTable[(uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar8 & 0x1fU)]) {
      uVar8 = (ms->window).dictLimit;
      uVar35 = (ms->window).lowLimit - iVar18;
      pUVar43 = pZVar5->chainTable;
      uVar14 = 0;
      local_d8 = 0;
      do {
        local_124 = local_124 - 1;
        uVar15 = uVar14;
        if (local_d8 < uVar14) {
          uVar15 = local_d8;
        }
        uVar42 = (uint)uVar13;
        pBVar1 = pBVar20 + uVar13;
        sVar11 = ZSTD_count_2segments(ip + uVar15,pBVar1 + uVar15,iend,pBVar4,pBVar3 + uVar8);
        uVar15 = sVar11 + uVar15;
        pBVar29 = pBVar3 + uVar13 + uVar35;
        if (uVar15 + uVar13 < (uVar26 & 0xffffffff)) {
          pBVar29 = pBVar1;
        }
        if (uVar9 < uVar15) {
          uVar23 = uVar35 + uVar42;
          iVar18 = uVar32 - uVar23;
          uVar22 = iVar18 + 1;
          if ((uVar22 == 0) || (uVar34 = (int)*offBasePtr + 1, uVar34 == 0)) {
LAB_002053f5:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                          ,0xab,"unsigned int ZSTD_highbit32(U32)");
          }
          iVar6 = 0x1f;
          if (uVar22 != 0) {
            for (; uVar22 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          iVar7 = 0x1f;
          if (uVar34 != 0) {
            for (; uVar34 >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          if (iVar6 - iVar7 < ((int)uVar15 - (int)uVar9) * 4) {
            if (uVar32 == uVar23) {
              __assert_fail("(curr - matchIndex)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0xcc,
                            "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                           );
            }
            *offBasePtr = (ulong)(iVar18 + 3);
            uVar9 = uVar15;
          }
          bVar46 = ip + uVar15 == iend;
          if (!bVar46) goto LAB_00205264;
        }
        else {
LAB_00205264:
          puVar27 = pUVar43 + (uVar42 & uVar30) * 2;
          if (pBVar29[uVar15] < ip[uVar15]) {
            bVar46 = true;
            if (uVar44 < uVar42) {
              puVar27 = puVar27 + 1;
              uVar16 = uVar14;
              local_d8 = uVar15;
LAB_002052a9:
              uVar13 = (ulong)*puVar27;
              bVar46 = false;
              uVar14 = uVar16;
            }
          }
          else {
            bVar46 = true;
            uVar16 = uVar15;
            if (uVar44 < uVar42) goto LAB_002052a9;
          }
        }
      } while (((!bVar46) && (local_124 != 0)) && (uVar38 < (uint)uVar13));
    }
    if ((2 < uVar9) && (*offBasePtr < 4)) {
      __assert_fail("OFFBASE_IS_OFFSET(*offsetPtr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0xe0,
                    "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if (uVar39 <= uVar32 + 8) {
    __assert_fail("matchEndIdx > curr+8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x173,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar39 - 8;
  if ((2 < uVar9) && (*offBasePtr < 4)) {
    __assert_fail("OFFBASE_IS_OFFSET(*offBasePtr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x176,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  return uVar9;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offBasePtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        for (; nbCompares && (matchIndex > windowLow); --nbCompares) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr - matchIndex + 1) - ZSTD_highbit32((U32)*offBasePtr)) )
                    bestLength = matchLength, *offBasePtr = OFFSET_TO_OFFBASE(curr - matchIndex);
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)); /* Check we haven't underflowed. */
        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offBasePtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offBasePtr); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offBasePtr, mIndex);
        }
        return bestLength;
    }
}